

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O2

int __thiscall jrtplib::RTPSession::SendPacket(RTPSession *this,RTPPacket *packet)

{
  int iVar1;
  
  if (this->created == true) {
    iVar1 = SendRTPData(this,packet->packet,packet->packetlength);
    if (-1 < iVar1) {
      RTPSources::SentRTPPacket(&(this->sources).super_RTPSources);
      this->sentpackets = true;
      iVar1 = 0;
    }
    return iVar1;
  }
  return -0x3e;
}

Assistant:

int RTPSession::SendPacket(RTPPacket *packet) 
{
	int status;
	
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	BUILDER_LOCK
	if ((status = SendRTPData(packet->GetPacketData(), packet->GetPacketLength())) < 0)
	{
		BUILDER_UNLOCK
		return status;
	}
	BUILDER_UNLOCK

	SOURCES_LOCK
	sources.SentRTPPacket();
	SOURCES_UNLOCK
	PACKSENT_LOCK
	sentpackets = true;
	PACKSENT_UNLOCK
	return 0;
}